

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O1

GMM_STATUS
GmmLib::__GmmDeviceDealloc
          (GMM_CLIENT ClientType,GMM_DEVICE_CALLBACKS_INT *DeviceCb,GMM_DEVICE_DEALLOC *pDealloc,
          GmmClientContext *pClientContext)

{
  int iVar1;
  GMM_STATUS GVar2;
  GMM_DDI_DEALLOCATE local_28;
  GMM_DDI_DEALLOCATE DeAlloc;
  
  local_28.bo = (void *)0x0;
  iVar1 = GmmCheckForNullDevCbPfn(ClientType,DeviceCb,GMM_DEV_CB_DEALLOC);
  if (iVar1 == 0) {
    GVar2 = GMM_INVALIDPARAM;
  }
  else {
    iVar1 = GmmCheckForNullDevCbPfn(ClientType,DeviceCb,GMM_DEV_CB_DEALLOC);
    if (iVar1 == 0) {
      GVar2 = GMM_SUCCESS;
    }
    else {
      local_28.bo = pDealloc->Handle;
      iVar1 = GmmDeviceCallback(ClientType,DeviceCb,&local_28);
      GVar2 = (GMM_STATUS)(iVar1 != 0);
    }
  }
  return GVar2;
}

Assistant:

GMM_STATUS GmmLib::__GmmDeviceDealloc(GMM_CLIENT                ClientType,
                                      GMM_DEVICE_CALLBACKS_INT *DeviceCb,
                                      GMM_DEVICE_DEALLOC *      pDealloc,
                                      GmmClientContext *        pClientContext)

{
    GMM_DDI_DEALLOCATE DeAlloc = {0};
    int                err     = 0;

    __GMM_ASSERTPTR(GmmCheckForNullDevCbPfn(ClientType, DeviceCb, GMM_DEV_CB_DEALLOC), GMM_INVALIDPARAM);

    if(GmmCheckForNullDevCbPfn(ClientType, DeviceCb, GMM_DEV_CB_DEALLOC))
    {
        DeAlloc.bo = pDealloc->Handle;

        err = GmmDeviceCallback(ClientType, DeviceCb, &DeAlloc);
    }

    return (err == 0) ? GMM_SUCCESS : GMM_ERROR;
}